

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

sexp_conflict
sexp_scheduler(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict root_thread)

{
  sexp psVar1;
  uint *puVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  pollfd *ppVar8;
  sexp_conflict psVar9;
  pollfd pVar10;
  pollfd pVar11;
  undefined8 extraout_RDX;
  pollfd extraout_RDX_00;
  pollfd extraout_RDX_01;
  sexp_sint_t n_00;
  pollfd extraout_RDX_02;
  pollfd pVar12;
  pollfd extraout_RDX_03;
  sexp_conflict *ppsVar13;
  pollfd pVar14;
  __useconds_t __useconds;
  pollfd *ppVar15;
  pollfd pVar16;
  undefined1 *puVar17;
  long lVar18;
  undefined1 auVar19 [16];
  sexp_conflict tmp;
  timeval tval;
  sexp_gc_var_t __sexp_gc_preserver1;
  pollfd local_80;
  pollfd local_78;
  pollfd local_70;
  sexp_conflict *local_68;
  timeval local_60;
  pollfd local_50;
  sexp_gc_var_t local_48;
  
  local_80.fd = 0x43e;
  local_80.events = 0;
  local_80.revents = 0;
  local_48.var = (sexp_conflict *)&local_80;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  psVar1 = (ctx->value).type.setters;
  pVar11 = (pollfd)(psVar1->value).context.mark_stack[9].prev;
  pVar14 = (pollfd)(psVar1->value).context.mark_stack[10].end;
  if (((psVar1->value).context.mark_stack[10].prev != (sexp_mark_stack_ptr_t *)0x1) &&
     (psVar9 = (sexp_conflict)(psVar1->value).context.mark_stack[0xb].start,
     ((ulong)psVar9 & 3) == 0)) {
    if (psVar9->tag == 0x24) {
      if ((psVar9->value).flonum_bits[0x60a3] != '\0') {
        (psVar9->value).flonum_bits[0x60a3] = '\0';
        sexp_thread_start(ctx,self,n,psVar9);
        n = (sexp_sint_t)extraout_RDX_00;
      }
    }
    else if (psVar9->tag == 0x17) {
      local_80 = (pollfd)sexp_intern(ctx,"signal-runner",0xffffffffffffffff);
      auVar19 = sexp_env_cell(ctx,psVar9,local_80,0);
      n = auVar19._8_8_;
      local_80 = auVar19._0_8_;
      if (((((auVar19 & (undefined1  [16])0x3) == (undefined1  [16])0x0) && (*(int *)local_80 == 6))
          && (psVar9 = *(sexp_conflict *)((long)local_80 + 0x10), ((ulong)psVar9 & 3) == 0)) &&
         (psVar9->tag == 0x14)) {
        psVar9 = sexp_make_thread(ctx,self,n,psVar9,(sexp_conflict)&DAT_0000003e);
        (((ctx->value).type.setters)->value).context.mark_stack[0xb].start = (sexp_conflict *)psVar9
        ;
        sexp_thread_start(ctx,self,n_00,psVar9);
        n = (sexp_sint_t)extraout_RDX_02;
        if ((((ulong)pVar11 & 3) != 0) || (*(int *)pVar11 != 6)) {
          pVar11 = (pollfd)(((ctx->value).type.setters)->value).context.mark_stack[9].prev;
        }
      }
    }
  }
  psVar1 = (ctx->value).type.setters;
  ppsVar13 = (psVar1->value).context.mark_stack[0xb].end;
  if (((((ulong)ppsVar13 & 3) == 0) &&
      ((long)(psVar1->value).context.mark_stack[0xc].prev >> 1 == (ulong)*(uint *)ppsVar13)) &&
     (ppsVar13[2] != (sexp_conflict)0x0)) {
    local_70 = *(pollfd *)(ppsVar13 + 1);
    local_68 = ppsVar13;
    iVar4 = poll((pollfd *)local_70,(nfds_t)ppsVar13[2],0);
    uVar5 = *(uint *)(local_68 + 2) - 1;
    n._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
    n._0_1_ = 0 < iVar4 && -1 < (int)uVar5;
    if (0 < iVar4 && -1 < (int)uVar5) {
      puVar17 = (undefined1 *)(ulong)uVar5;
      local_50 = (pollfd)ctx;
      n = (sexp_sint_t)local_70;
      ppsVar13 = local_68;
      do {
        if (0 < ((short *)(n + 6))[(long)puVar17 * 4]) {
          puVar2 = *(uint **)((long)ctx + 0x58);
          if ((((ulong)puVar2 & 3) == 0) && ((*puVar2 & 0xfffffffe) == 0x10)) {
            if (*(FILE **)(puVar2 + 8) == (FILE *)0x0) {
              piVar3 = *(int **)(puVar2 + 6);
              lVar7 = -1;
              if ((((ulong)piVar3 & 3) == 0) && (*piVar3 == 0x12)) {
                lVar7 = *(long *)(piVar3 + 4);
              }
            }
            else {
              local_78.fd = iVar4;
              iVar4 = fileno(*(FILE **)(puVar2 + 8));
              lVar7 = (long)iVar4;
              n = (sexp_sint_t)local_70;
              ppsVar13 = local_68;
              iVar4 = local_78.fd;
            }
            if (lVar7 != ((pollfd *)(n + (long)puVar17 * 8))->fd) goto LAB_00102f86;
LAB_00102f98:
            *(undefined2 *)((long)ctx + 0x60aa) = 0;
            *(undefined8 *)((long)ctx + 0x58) = 0x3e;
          }
          else {
LAB_00102f86:
            if ((((ulong)puVar2 & 1) != 0) &&
               ((long)puVar2 >> 1 == (long)((pollfd *)(n + (long)puVar17 * 8))->fd))
            goto LAB_00102f98;
          }
          if (((ulong)pVar14 & 3) == 0) {
            pVar12.fd = 0x23e;
            pVar12.events = 0;
            pVar12.revents = 0;
            pVar16 = pVar14;
            do {
              if (*(int *)pVar16 != 6) break;
              puVar2 = *(uint **)(*(long *)((long)pVar16 + 8) + 0x58);
              if ((((ulong)puVar2 & 3) == 0) && ((*puVar2 & 0xfffffffe) == 0x10)) {
                local_78 = pVar12;
                if (*(FILE **)(puVar2 + 8) == (FILE *)0x0) {
                  piVar3 = *(int **)(puVar2 + 6);
                  lVar7 = -1;
                  if ((((ulong)piVar3 & 3) == 0) && (*piVar3 == 0x12)) {
                    lVar7 = *(long *)(piVar3 + 4);
                  }
                }
                else {
                  iVar6 = fileno(*(FILE **)(puVar2 + 8));
                  lVar7 = (long)iVar6;
                  n = (sexp_sint_t)local_70;
                  ctx = (sexp_conflict)local_50;
                  ppsVar13 = local_68;
                }
                pVar12 = local_78;
                if (lVar7 != ((pollfd *)(n + (long)puVar17 * 8))->fd) goto LAB_00103075;
LAB_00103087:
                ppVar15 = &local_80;
                *(undefined1 *)(*(long *)((long)pVar16 + 8) + 0x60ab) = 0;
                *(undefined1 *)(*(long *)((long)pVar16 + 8) + 0x60aa) = 0;
                *(undefined8 *)(*(long *)((long)pVar16 + 8) + 0x58) = 0x3e;
                if (pVar12 == (pollfd)0x23e) {
                  ppVar8 = (pollfd *)(*(long *)((long)ctx + 0x28) + 0x170);
                  pVar14 = *(pollfd *)((long)pVar16 + 0x10);
                }
                else {
                  ppVar8 = (pollfd *)((long)pVar12 + 0x10);
                }
                *ppVar8 = *(pollfd *)((long)pVar16 + 0x10);
                local_80 = *(pollfd *)((long)pVar16 + 0x10);
                ((int *)((long)pVar16 + 0x10))[0] = 0x23e;
                ((int *)((long)pVar16 + 0x10))[1] = 0;
                if (*(pollfd *)((long)pVar16 + 8) != (pollfd)ctx) {
                  piVar3 = *(int **)(*(long *)((long)ctx + 0x28) + 0x168);
                  if ((((ulong)piVar3 & 3) == 0) && (*piVar3 == 6)) {
                    ppVar8 = (pollfd *)(piVar3 + 4);
                  }
                  else {
                    ppVar8 = (pollfd *)(*(long *)((long)ctx + 0x28) + 0x160);
                    pVar11 = pVar16;
                  }
                  *ppVar8 = pVar16;
                  *(pollfd *)(*(long *)((long)ctx + 0x28) + 0x168) = pVar16;
                }
              }
              else {
LAB_00103075:
                if ((((ulong)puVar2 & 1) != 0) &&
                   ((long)puVar2 >> 1 == (long)((pollfd *)(n + (long)puVar17 * 8))->fd))
                goto LAB_00103087;
                ppVar15 = (pollfd *)((long)pVar16 + 0x10);
                pVar12 = pVar16;
              }
              pVar16 = *ppVar15;
            } while (((ulong)pVar16 & 3) == 0);
          }
          if (puVar17 < (undefined1 *)((long)&ppsVar13[2][-1].value + 0x60bfU)) {
            *(pollfd *)(n + (long)puVar17 * 8) = ((pollfd *)(n + -8))[(long)ppsVar13[2]];
          }
          iVar4 = iVar4 + -1;
          ppsVar13[2] = (sexp_conflict)((long)&ppsVar13[2][-1].value + 0x60bf);
        }
      } while ((0 < (long)puVar17) && (puVar17 = puVar17 + -1, 0 < iVar4));
    }
  }
  pVar16 = pVar14;
  if ((*(long *)((long)ctx + 0x6088) < 1) && (((ulong)pVar14 & 3) == 0)) {
    n._0_4_ = 0x23e;
    n._4_2_ = 0;
    n._6_2_ = 0;
    do {
      if (*(int *)pVar14 != 6) break;
      if (*(pollfd *)(*(long *)((long)pVar14 + 8) + 0x58) == (pollfd)ctx) {
        *(undefined1 *)(*(long *)((long)pVar14 + 8) + 0x60ab) = 0;
        *(undefined1 *)(*(long *)((long)pVar14 + 8) + 0x60aa) = 0;
        if ((pollfd)n == (pollfd)0x23e) {
          ppVar15 = (pollfd *)(*(long *)((long)ctx + 0x28) + 0x170);
          pVar16 = *(pollfd *)((long)pVar14 + 0x10);
        }
        else {
          ppVar15 = (pollfd *)(n + 0x10);
        }
        *ppVar15 = *(pollfd *)((long)pVar14 + 0x10);
        local_80 = *(pollfd *)((long)pVar14 + 0x10);
        ((int *)((long)pVar14 + 0x10))[0] = 0x23e;
        ((int *)((long)pVar14 + 0x10))[1] = 0;
        piVar3 = *(int **)(*(long *)((long)ctx + 0x28) + 0x168);
        if ((((ulong)piVar3 & 3) == 0) && (*piVar3 == 6)) {
          ppVar15 = (pollfd *)(piVar3 + 4);
        }
        else {
          ppVar15 = (pollfd *)(*(long *)((long)ctx + 0x28) + 0x160);
          pVar11 = pVar14;
        }
        *ppVar15 = pVar14;
        *(pollfd *)(*(long *)((long)ctx + 0x28) + 0x168) = pVar14;
        ppVar15 = &local_80;
      }
      else {
        n = (sexp_sint_t)pVar14;
        ppVar15 = (pollfd *)((long)pVar14 + 0x10);
      }
      pVar14 = *ppVar15;
    } while (((ulong)pVar14 & 3) == 0);
  }
  if (((((ulong)pVar16 & 3) == 0) && (*(int *)pVar16 == 6)) &&
     (iVar4 = gettimeofday(&local_60,(__timezone_ptr_t)0x0), n = (sexp_sint_t)extraout_RDX_01,
     iVar4 == 0)) {
    pVar10.fd = 0x23e;
    pVar10.events = 0;
    pVar10.revents = 0;
    n = (sexp_sint_t)extraout_RDX_01;
    pVar14 = pVar16;
    pVar12 = pVar16;
    if (*(int *)pVar16 == 6) {
      while( true ) {
        lVar7 = *(long *)((long)pVar12 + 8);
        lVar18 = *(long *)(lVar7 + 0x6098);
        n = local_60.tv_usec;
        pVar14 = pVar12;
        if (((lVar18 == 0) && (*(long *)(lVar7 + 0x60a0) == 0)) ||
           ((local_60.tv_sec <= lVar18 &&
            ((lVar18 != local_60.tv_sec || (local_60.tv_usec <= *(long *)(lVar7 + 0x60a0)))))))
        break;
        *(undefined1 *)(lVar7 + 0x60aa) = 1;
        *(undefined1 *)(*(long *)((long)pVar12 + 8) + 0x60ab) = 0;
        pVar14 = *(pollfd *)((long)pVar12 + 0x10);
        pVar10 = pVar12;
        if ((((ulong)pVar14 & 3) != 0) || (pVar12 = pVar14, *(int *)pVar14 != 6)) break;
      }
    }
    if ((((ulong)pVar10 & 2) == 0) && (*(int *)pVar10 == 6)) {
      ((int *)((long)pVar10 + 0x10))[0] = 0x23e;
      ((int *)((long)pVar10 + 0x10))[1] = 0;
      n = *(sexp_sint_t *)(*(long *)((long)ctx + 0x28) + 0x168);
      if (((n & 3U) == 0) && (*(int *)n == 6)) {
        pVar12 = (pollfd)(n + 0x10);
        n = (sexp_sint_t)pVar12;
      }
      else {
        pVar12 = (pollfd)(*(long *)((long)ctx + 0x28) + 0x160);
        pVar11 = pVar16;
      }
      *(pollfd *)pVar12 = pVar16;
      *(pollfd *)(*(long *)((long)ctx + 0x28) + 0x168) = pVar10;
      *(pollfd *)(*(long *)((long)ctx + 0x28) + 0x170) = pVar14;
      pVar16 = pVar14;
    }
  }
  if ((((ulong)pVar11 & 3) == 0) && (*(int *)pVar11 == 6)) {
    pVar14 = *(pollfd *)((long)pVar11 + 8);
    if ((*(long *)((long)ctx + 0x6088) < 1) || (*(char *)((long)ctx + 0x60ab) != '\0')) {
      *(undefined8 *)(*(long *)((long)ctx + 0x28) + 0x160) = *(undefined8 *)((long)pVar11 + 0x10);
      if ((((ulong)*(int **)((long)pVar11 + 0x10) & 3) != 0) ||
         (**(int **)((long)pVar11 + 0x10) != 6)) {
        *(undefined8 *)(*(long *)((long)ctx + 0x28) + 0x168) = 0x23e;
      }
      if (0 < *(long *)((long)ctx + 0x6088)) {
        auVar19 = sexp_memq_op(ctx,0,2,ctx);
        n = auVar19._8_8_;
        if (auVar19._0_8_ == 0x3e) {
          sexp_insert_timed(ctx,ctx,(sexp_conflict)&DAT_0000003e);
          n = (sexp_sint_t)extraout_RDX_03;
        }
      }
      pVar16 = *(pollfd *)(*(long *)((long)ctx + 0x28) + 0x170);
    }
    else {
      *(sexp_conflict *)(*(long *)(*(long *)((long)ctx + 0x28) + 0x160) + 8) = ctx;
      *(undefined8 *)(*(long *)(*(long *)((long)ctx + 0x28) + 0x168) + 0x10) =
           *(undefined8 *)(*(long *)((long)ctx + 0x28) + 0x160);
      *(undefined8 *)(*(long *)((long)ctx + 0x28) + 0x160) =
           *(undefined8 *)(*(long *)(*(long *)((long)ctx + 0x28) + 0x160) + 0x10);
      *(undefined8 *)(*(long *)((long)ctx + 0x28) + 0x168) =
           *(undefined8 *)(*(long *)(*(long *)((long)ctx + 0x28) + 0x168) + 0x10);
      *(undefined8 *)(*(long *)(*(long *)((long)ctx + 0x28) + 0x168) + 0x10) = 0x23e;
    }
  }
  else {
    pVar14 = (pollfd)ctx;
    if ((*(long *)((long)ctx + 0x6088) < 1) && (pVar11 = pVar16, ((ulong)pVar16 & 3) == 0)) {
      while (pVar14 = (pollfd)ctx, *(int *)pVar11 == 6) {
        pVar14 = *(pollfd *)((long)pVar11 + 8);
        puVar2 = *(uint **)((long)pVar14 + 0x58);
        if ((((ulong)puVar2 & 1) != 0) ||
           (((((ulong)puVar2 & 2) == 0 && ((*puVar2 & 0xfffffffe) == 0x10)) ||
            (ppVar15 = (pollfd *)((long)pVar11 + 0x10), pVar11 = *ppVar15, pVar14 = (pollfd)ctx,
            ((ulong)*ppVar15 & 3) != 0)))) break;
      }
    }
  }
  pVar11 = pVar14;
  if (*(char *)((long)pVar14 + 0x60ab) == '\0') goto LAB_0010362f;
  if ((((ulong)pVar16 & 3) == 0) && (*(int *)pVar16 == 6)) {
    pVar11 = *(pollfd *)((long)pVar16 + 8);
    lVar7 = *(long *)((long)pVar11 + 0x6098);
    if (((lVar7 == 0) && (*(long *)((long)pVar11 + 0x60a0) == 0)) ||
       ((*(long *)((long)pVar14 + 0x6098) <= lVar7 &&
        ((lVar7 != *(long *)((long)pVar14 + 0x6098) ||
         (*(long *)((long)pVar14 + 0x60a0) <= *(long *)((long)pVar11 + 0x60a0)))))))
    goto LAB_0010359d;
    *(undefined8 *)(*(long *)((long)ctx + 0x28) + 0x170) = *(undefined8 *)((long)pVar16 + 0x10);
    local_80 = pVar14;
    lVar7 = sexp_memq_op(ctx,0,2,pVar14);
    if (lVar7 == 0x3e) {
      sexp_insert_timed(ctx,(sexp_conflict)local_80,(sexp_conflict)local_80);
    }
  }
  else {
LAB_0010359d:
    sexp_delete_list(ctx,pVar14.fd,(sexp_conflict)n);
    pVar11 = pVar14;
  }
  if ((*(long *)((long)pVar11 + 0x6098) == 0) && (*(long *)((long)pVar11 + 0x60a0) == 0)) {
    __useconds = 10000;
  }
  else {
    lVar18 = 0;
    gettimeofday(&local_60,(__timezone_ptr_t)0x0);
    lVar7 = *(long *)((long)pVar11 + 0x6098) - local_60.tv_sec;
    if (local_60.tv_sec <= *(long *)((long)pVar11 + 0x6098)) {
      lVar18 = lVar7 * 1000000;
      if (0 < lVar7 || local_60.tv_usec < *(long *)((long)pVar11 + 0x60a0)) {
        lVar18 = (lVar18 - local_60.tv_usec) + *(long *)((long)pVar11 + 0x60a0);
      }
    }
    __useconds = 10000;
    if (lVar18 < 0x2711) {
      *(undefined2 *)((long)pVar11 + 0x60aa) = 1;
      __useconds = (__useconds_t)lVar18;
    }
  }
  usleep(__useconds);
LAB_0010362f:
  *(sexp_gc_var_t **)((long)ctx + 0x6080) = local_48.next;
  return (sexp_conflict)pVar11;
}

Assistant:

sexp sexp_scheduler (sexp ctx, sexp self, sexp_sint_t n, sexp root_thread) {
  int i, k;
  struct timeval tval;
  struct pollfd *pfds;
  suseconds_t usecs = 0;
  sexp res, ls1, ls2, evt, runner, paused, front, pollfds;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);

  front  = sexp_global(ctx, SEXP_G_THREADS_FRONT);
  paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);

  /* check signals */
  if (sexp_global(ctx, SEXP_G_THREADS_SIGNALS) != SEXP_ZERO) {
    runner = sexp_global(ctx, SEXP_G_THREADS_SIGNAL_RUNNER);
    if (! sexp_contextp(runner)) { /* ensure the runner exists */
      if (sexp_envp(runner)) {
        tmp = sexp_env_cell(ctx, runner, (tmp=sexp_intern(ctx, "signal-runner", -1)), 0);
        if (sexp_pairp(tmp) && sexp_procedurep(sexp_cdr(tmp))) {
          runner = sexp_make_thread(ctx, self, 2, sexp_cdr(tmp), SEXP_FALSE);
          sexp_global(ctx, SEXP_G_THREADS_SIGNAL_RUNNER) = runner;
          sexp_thread_start(ctx, self, 1, runner);
          if (!sexp_pairp(front))
            front = sexp_global(ctx, SEXP_G_THREADS_FRONT);
        }
      }
    } else if (sexp_context_waitp(runner)) { /* wake it if it's sleeping */
      sexp_context_waitp(runner) = 0;
      sexp_thread_start(ctx, self, 1, runner);
    }
  }

  /* check blocked fds */
  pollfds = sexp_global(ctx, SEXP_G_THREADS_POLL_FDS);
  if (sexp_pollfdsp(ctx, pollfds) && sexp_pollfds_num_fds(pollfds) > 0) {
    pfds = sexp_pollfds_fds(pollfds);
    k = poll(sexp_pollfds_fds(pollfds), sexp_pollfds_num_fds(pollfds), 0);
    for (i=sexp_pollfds_num_fds(pollfds)-1; i>=0 && k>0; --i) {
      if (pfds[i].revents > 0) { /* free all threads blocked on this fd */
        k--;
        /* maybe unblock the current thread */
        evt = sexp_context_event(ctx);
        if ((sexp_portp(evt) && (sexp_port_fileno(evt) == pfds[i].fd))
            || (sexp_fixnump(evt) && (sexp_unbox_fixnum(evt) == pfds[i].fd))) {
          sexp_context_waitp(ctx) = 0;
          sexp_context_timeoutp(ctx) = 0;
          sexp_context_event(ctx) = SEXP_FALSE;
        }
        /* maybe unblock paused threads */
        for (ls1=SEXP_NULL, ls2=paused; sexp_pairp(ls2); ) {
          /* TODO: distinguish input and output on the same fd? */
          evt = sexp_context_event(sexp_car(ls2));
          if ((sexp_portp(evt) && sexp_port_fileno(evt) == pfds[i].fd)
              || (sexp_fixnump(evt) && sexp_unbox_fixnum(evt) == pfds[i].fd)) {
            sexp_context_waitp(sexp_car(ls2)) = 0;
            sexp_context_timeoutp(sexp_car(ls2)) = 0;
            sexp_context_event(sexp_car(ls2)) = SEXP_FALSE;
            if (ls1==SEXP_NULL)
              sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = sexp_cdr(ls2);
            else
              sexp_cdr(ls1) = sexp_cdr(ls2);
            tmp = sexp_cdr(ls2);
            sexp_cdr(ls2) = SEXP_NULL;
            if (sexp_car(ls2) != ctx) {
              if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
                sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = ls2;
              } else {
                sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = ls2;
              }
              sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
            }
            ls2 = tmp;
          } else {
            ls1 = ls2;
            ls2 = sexp_cdr(ls2);
          }
        }
        if (i < (sexp_pollfds_num_fds(pollfds) - 1)) {
          pfds[i] = pfds[sexp_pollfds_num_fds(pollfds) - 1];
        }
        sexp_pollfds_num_fds(pollfds) -= 1;
      }
    }
  }

  /* if we've terminated, check threads joining us */
  if (sexp_context_refuel(ctx) <= 0) {
    for (ls1=SEXP_NULL, ls2=paused; sexp_pairp(ls2); ) {
      if (sexp_context_event(sexp_car(ls2)) == ctx) {
        sexp_context_waitp(sexp_car(ls2)) = 0;
        sexp_context_timeoutp(sexp_car(ls2)) = 0;
        if (ls1==SEXP_NULL)
          sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = sexp_cdr(ls2);
        else
          sexp_cdr(ls1) = sexp_cdr(ls2);
        tmp = sexp_cdr(ls2);
        sexp_cdr(ls2) = SEXP_NULL;
        if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
          sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = ls2;
        } else {
          sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = ls2;
        }
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
        ls2 = tmp;
      } else {
        ls1 = ls2;
        ls2 = sexp_cdr(ls2);
      }
    }
  }

  /* check timeouts */
  if (sexp_pairp(paused)) {
    if (gettimeofday(&tval, NULL) == 0) {
      ls1 = SEXP_NULL;
      ls2 = paused;
      while (sexp_pairp(ls2) && sexp_context_before(sexp_car(ls2), tval)) {
        sexp_context_timeoutp(sexp_car(ls2)) = 1;
        sexp_context_waitp(sexp_car(ls2)) = 0;
        ls1 = ls2;
        ls2 = sexp_cdr(ls2);
      }
      if (sexp_pairp(ls1)) {
        sexp_cdr(ls1) = SEXP_NULL;
        if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
          sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = paused;
        } else {
          sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = paused;
        }
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls1;
        sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = ls2;
      }
    }
  }

  /* dequeue next thread */
  if (sexp_pairp(front)) {
    res = sexp_car(front);
    if ((sexp_context_refuel(ctx) <= 0) || sexp_context_waitp(ctx)) {
      /* orig ctx is either terminated or paused */
      sexp_global(ctx, SEXP_G_THREADS_FRONT) = sexp_cdr(front);
      if (! sexp_pairp(sexp_cdr(front)))
        sexp_global(ctx, SEXP_G_THREADS_BACK) = SEXP_NULL;
      if (sexp_context_refuel(ctx) > 0 && sexp_not(sexp_memq(ctx, ctx, paused)))
        sexp_insert_timed(ctx, ctx, SEXP_FALSE);
      paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
    } else {
      /* swap with front of queue */
      sexp_car(sexp_global(ctx, SEXP_G_THREADS_FRONT)) = ctx;
      /* rotate front of queue to back */
      sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK))
        = sexp_global(ctx, SEXP_G_THREADS_FRONT);
      sexp_global(ctx, SEXP_G_THREADS_FRONT)
        = sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_FRONT));
      sexp_global(ctx, SEXP_G_THREADS_BACK)
        = sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK));
      sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = SEXP_NULL;
    }
  } else {
    /* no threads to dequeue */
    res = ctx;
    /* prefer a thread we can wait on instead of spinning */
    if (sexp_context_refuel(ctx) <= 0) {
      for (ls1=paused; sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
        evt = sexp_context_event(sexp_car(ls1));
        if (sexp_fixnump(evt) || sexp_portp(evt)) {
          res = sexp_car(ls1);
          break;
        }
      }
    }
  }

  if (sexp_context_waitp(res)) {
    /* the only thread available was waiting */
    /* TODO: if another thread is blocked on I/O, wait on that with
     * the appropriate minimum timeout */
    if (sexp_pairp(paused)
        && sexp_context_before(sexp_car(paused), sexp_context_timeval(res))) {
      tmp = res;
      res = sexp_car(paused);
      paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cdr(paused);
      if (sexp_not(sexp_memq(ctx, tmp, paused)))
        sexp_insert_timed(ctx, tmp, tmp);
    } else {
      sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, res);
    }
    paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
    usecs = 0;
    if ((sexp_context_timeval(res).tv_sec == 0)
        && (sexp_context_timeval(res).tv_usec == 0)) {
      /* no timeout, wait for default 10ms */
      usecs = 10*1000;
    } else {
      /* wait until the next timeout, or at most 10ms */
      gettimeofday(&tval, NULL);
      if (tval.tv_sec <= sexp_context_timeval(res).tv_sec) {
        usecs = (sexp_context_timeval(res).tv_sec - tval.tv_sec) * 1000000;
        if (tval.tv_usec < sexp_context_timeval(res).tv_usec || usecs > 0)
          usecs += sexp_context_timeval(res).tv_usec - tval.tv_usec;
      }
      if (usecs > 10*1000) {
        usecs = 10*1000;
      } else {
        sexp_context_waitp(res) = 0;
        sexp_context_timeoutp(res) = 1;
      }
    }
    /* take a nap to avoid busy looping */
    usleep(usecs);
  }

  sexp_gc_release1(ctx);
  return res;
}